

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_mathtypes.cpp
# Opt level: O1

void tst_vec2(void)

{
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"void tst_vec2()",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ok",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  return;
}

Assistant:

void tst_vec2()
{
    vec2 a(1, 2);
    vec2 b(3, 4);

    vec2 r = a + b;
    assert(r.x == 4);
    assert(r.y == 6);

    cout << __PRETTY_FUNCTION__ << ": ok" << endl;
}